

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_wrap.c
# Opt level: O1

void * chacha20_ctx_alloc(void)

{
  mbedtls_chacha20_context *ctx;
  
  ctx = (mbedtls_chacha20_context *)calloc(1,0x88);
  if (ctx == (mbedtls_chacha20_context *)0x0) {
    ctx = (mbedtls_chacha20_context *)0x0;
  }
  else {
    mbedtls_chacha20_init(ctx);
  }
  return ctx;
}

Assistant:

static void * chacha20_ctx_alloc( void )
{
    mbedtls_chacha20_context *ctx;
    ctx = mbedtls_calloc( 1, sizeof( mbedtls_chacha20_context ) );

    if( ctx == NULL )
        return( NULL );

    mbedtls_chacha20_init( ctx );

    return( ctx );
}